

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_options_common<wchar_t>::basic_json_options_common
          (basic_json_options_common<wchar_t> *this,basic_json_options_common<wchar_t> *param_1)

{
  pointer pwVar1;
  
  this->_vptr_basic_json_options_common = (_func_int **)&PTR__basic_json_options_common_00b390e8;
  *(undefined2 *)&this->field_0x8 = *(undefined2 *)&param_1->field_0x8;
  (this->nan_to_num_)._M_dataplus._M_p = (pointer)&(this->nan_to_num_).field_2;
  pwVar1 = (param_1->nan_to_num_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->nan_to_num_,pwVar1,pwVar1 + (param_1->nan_to_num_)._M_string_length);
  (this->inf_to_num_)._M_dataplus._M_p = (pointer)&(this->inf_to_num_).field_2;
  pwVar1 = (param_1->inf_to_num_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->inf_to_num_,pwVar1,pwVar1 + (param_1->inf_to_num_)._M_string_length);
  (this->neginf_to_num_)._M_dataplus._M_p = (pointer)&(this->neginf_to_num_).field_2;
  pwVar1 = (param_1->neginf_to_num_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->neginf_to_num_,pwVar1,
             pwVar1 + (param_1->neginf_to_num_)._M_string_length);
  (this->nan_to_str_)._M_dataplus._M_p = (pointer)&(this->nan_to_str_).field_2;
  pwVar1 = (param_1->nan_to_str_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->nan_to_str_,pwVar1,pwVar1 + (param_1->nan_to_str_)._M_string_length);
  (this->inf_to_str_)._M_dataplus._M_p = (pointer)&(this->inf_to_str_).field_2;
  pwVar1 = (param_1->inf_to_str_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->inf_to_str_,pwVar1,pwVar1 + (param_1->inf_to_str_)._M_string_length);
  (this->neginf_to_str_)._M_dataplus._M_p = (pointer)&(this->neginf_to_str_).field_2;
  pwVar1 = (param_1->neginf_to_str_)._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->neginf_to_str_,pwVar1,
             pwVar1 + (param_1->neginf_to_str_)._M_string_length);
  this->max_nesting_depth_ = param_1->max_nesting_depth_;
  return;
}

Assistant:

basic_json_options_common(const basic_json_options_common&) = default;